

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::SetPrimElementName(Value *v,string *elementName)

{
  Model *pMVar1;
  GeomSubset *pGVar2;
  Scope *pSVar3;
  Xform *pXVar4;
  GeomMesh *pGVar5;
  GPrim *pGVar6;
  GeomPoints *pGVar7;
  GeomCube *pGVar8;
  GeomCapsule *pGVar9;
  GeomCylinder *pGVar10;
  GeomSphere *pGVar11;
  GeomCone *pGVar12;
  GeomCamera *pGVar13;
  GeomBasisCurves *pGVar14;
  DomeLight *pDVar15;
  RectLight *pRVar16;
  SphereLight *pSVar17;
  CylinderLight *pCVar18;
  DiskLight *pDVar19;
  Material *pMVar20;
  UsdPreviewSurface *pUVar21;
  Shader *pSVar22;
  UsdUVTexture *pUVar23;
  UsdPrimvarReader<int> *pUVar24;
  UsdPrimvarReader<float> *pUVar25;
  UsdPrimvarReader<std::array<float,_2UL>_> *pUVar26;
  UsdPrimvarReader<std::array<float,_3UL>_> *pUVar27;
  UsdPrimvarReader<std::array<float,_4UL>_> *pUVar28;
  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pUVar29;
  UsdPrimvarReader<tinyusdz::value::normal3f> *pUVar30;
  UsdPrimvarReader<tinyusdz::value::vector3f> *pUVar31;
  UsdPrimvarReader<tinyusdz::value::point3f> *pUVar32;
  UsdPrimvarReader<tinyusdz::value::matrix4d> *pUVar33;
  SkelRoot *pSVar34;
  Skeleton *pSVar35;
  SkelAnimation *pSVar36;
  BlendShape *pBVar37;
  
  pMVar1 = value::Value::as<tinyusdz::Model>(v,false);
  if (pMVar1 == (Model *)0x0) {
    pSVar3 = value::Value::as<tinyusdz::Scope>(v,false);
    if (pSVar3 == (Scope *)0x0) {
      pXVar4 = value::Value::as<tinyusdz::Xform>(v,false);
      if (pXVar4 == (Xform *)0x0) {
        pGVar6 = value::Value::as<tinyusdz::GPrim>(v,false);
        if (pGVar6 == (GPrim *)0x0) {
          pGVar5 = value::Value::as<tinyusdz::GeomMesh>(v,false);
          if (pGVar5 == (GeomMesh *)0x0) {
            pGVar7 = value::Value::as<tinyusdz::GeomPoints>(v,false);
            if (pGVar7 == (GeomPoints *)0x0) {
              pGVar8 = value::Value::as<tinyusdz::GeomCube>(v,false);
              if (pGVar8 == (GeomCube *)0x0) {
                pGVar9 = value::Value::as<tinyusdz::GeomCapsule>(v,false);
                if (pGVar9 == (GeomCapsule *)0x0) {
                  pGVar10 = value::Value::as<tinyusdz::GeomCylinder>(v,false);
                  if (pGVar10 == (GeomCylinder *)0x0) {
                    pGVar11 = value::Value::as<tinyusdz::GeomSphere>(v,false);
                    if (pGVar11 == (GeomSphere *)0x0) {
                      pGVar12 = value::Value::as<tinyusdz::GeomCone>(v,false);
                      if (pGVar12 == (GeomCone *)0x0) {
                        pGVar2 = value::Value::as<tinyusdz::GeomSubset>(v,false);
                        if (pGVar2 != (GeomSubset *)0x0) {
                          pGVar2 = value::Value::as<tinyusdz::GeomSubset>(v,false);
                          goto LAB_0028a7f5;
                        }
                        pGVar13 = value::Value::as<tinyusdz::GeomCamera>(v,false);
                        if (pGVar13 == (GeomCamera *)0x0) {
                          pGVar14 = value::Value::as<tinyusdz::GeomBasisCurves>(v,false);
                          if (pGVar14 == (GeomBasisCurves *)0x0) {
                            pDVar15 = value::Value::as<tinyusdz::DomeLight>(v,false);
                            if (pDVar15 == (DomeLight *)0x0) {
                              pSVar17 = value::Value::as<tinyusdz::SphereLight>(v,false);
                              if (pSVar17 == (SphereLight *)0x0) {
                                pCVar18 = value::Value::as<tinyusdz::CylinderLight>(v,false);
                                if (pCVar18 == (CylinderLight *)0x0) {
                                  pDVar19 = value::Value::as<tinyusdz::DiskLight>(v,false);
                                  if (pDVar19 == (DiskLight *)0x0) {
                                    pRVar16 = value::Value::as<tinyusdz::RectLight>(v,false);
                                    if (pRVar16 == (RectLight *)0x0) {
                                      pMVar20 = value::Value::as<tinyusdz::Material>(v,false);
                                      if (pMVar20 == (Material *)0x0) {
                                        pSVar22 = value::Value::as<tinyusdz::Shader>(v,false);
                                        if (pSVar22 == (Shader *)0x0) {
                                          pUVar21 = value::Value::as<tinyusdz::UsdPreviewSurface>
                                                              (v,false);
                                          if (pUVar21 == (UsdPreviewSurface *)0x0) {
                                            pUVar23 = value::Value::as<tinyusdz::UsdUVTexture>
                                                                (v,false);
                                            if (pUVar23 == (UsdUVTexture *)0x0) {
                                              pUVar24 = value::Value::
                                                        as<tinyusdz::UsdPrimvarReader<int>>(v,false)
                                              ;
                                              if (pUVar24 == (UsdPrimvarReader<int> *)0x0) {
                                                pUVar25 = value::Value::
                                                          as<tinyusdz::UsdPrimvarReader<float>>
                                                                    (v,false);
                                                if (pUVar25 == (UsdPrimvarReader<float> *)0x0) {
                                                  pUVar26 = value::Value::
                                                                                                                        
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            (v,false);
                                                  if (pUVar26 ==
                                                      (UsdPrimvarReader<std::array<float,_2UL>_> *)
                                                      0x0) {
                                                    pUVar27 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            (v,false);
                                                  if (pUVar27 ==
                                                      (UsdPrimvarReader<std::array<float,_3UL>_> *)
                                                      0x0) {
                                                    pUVar28 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            (v,false);
                                                  if (pUVar28 ==
                                                      (UsdPrimvarReader<std::array<float,_4UL>_> *)
                                                      0x0) {
                                                    pUVar29 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            (v,false);
                                                  if (pUVar29 ==
                                                      (
                                                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)0x0) {
                                                    pUVar30 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            (v,false);
                                                  if (pUVar30 ==
                                                      (UsdPrimvarReader<tinyusdz::value::normal3f> *
                                                      )0x0) {
                                                    pUVar31 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            (v,false);
                                                  if (pUVar31 ==
                                                      (UsdPrimvarReader<tinyusdz::value::vector3f> *
                                                      )0x0) {
                                                    pUVar32 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            (v,false);
                                                  if (pUVar32 ==
                                                      (UsdPrimvarReader<tinyusdz::value::point3f> *)
                                                      0x0) {
                                                    pUVar33 = value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            (v,false);
                                                  if (pUVar33 ==
                                                      (UsdPrimvarReader<tinyusdz::value::matrix4d> *
                                                      )0x0) {
                                                    pSVar34 = value::Value::as<tinyusdz::SkelRoot>
                                                                        (v,false);
                                                    if (pSVar34 == (SkelRoot *)0x0) {
                                                      pSVar35 = value::Value::as<tinyusdz::Skeleton>
                                                                          (v,false);
                                                      if (pSVar35 == (Skeleton *)0x0) {
                                                        pSVar36 = value::Value::
                                                                  as<tinyusdz::SkelAnimation>
                                                                            (v,false);
                                                        if (pSVar36 == (SkelAnimation *)0x0) {
                                                          pBVar37 = value::Value::
                                                                    as<tinyusdz::BlendShape>
                                                                              (v,false);
                                                          if (pBVar37 == (BlendShape *)0x0) {
                                                            return false;
                                                          }
                                                          pUVar21 = (UsdPreviewSurface *)
                                                                    value::Value::
                                                                    as<tinyusdz::BlendShape>
                                                                              (v,false);
                                                        }
                                                        else {
                                                          pUVar21 = (UsdPreviewSurface *)
                                                                    value::Value::
                                                                    as<tinyusdz::SkelAnimation>
                                                                              (v,false);
                                                        }
                                                        goto LAB_0028a7fb;
                                                      }
                                                      pSVar35 = value::Value::as<tinyusdz::Skeleton>
                                                                          (v,false);
                                                    }
                                                    else {
                                                      pSVar35 = (Skeleton *)
                                                                value::Value::as<tinyusdz::SkelRoot>
                                                                          (v,false);
                                                    }
                                                    pUVar21 = (UsdPreviewSurface *)&pSVar35->name;
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                                            (v,false);
                                                  }
                                                  }
                                                  else {
                                                    pUVar21 = (UsdPreviewSurface *)
                                                              value::Value::
                                                                                                                            
                                                  as<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                                                            (v,false);
                                                  }
                                                }
                                                else {
                                                  pUVar21 = (UsdPreviewSurface *)
                                                            value::Value::
                                                            as<tinyusdz::UsdPrimvarReader<float>>
                                                                      (v,false);
                                                }
                                              }
                                              else {
                                                pUVar21 = (UsdPreviewSurface *)
                                                          value::Value::
                                                          as<tinyusdz::UsdPrimvarReader<int>>
                                                                    (v,false);
                                              }
                                            }
                                            else {
                                              pUVar21 = (UsdPreviewSurface *)
                                                        value::Value::as<tinyusdz::UsdUVTexture>
                                                                  (v,false);
                                            }
                                          }
                                          else {
                                            pUVar21 = value::Value::as<tinyusdz::UsdPreviewSurface>
                                                                (v,false);
                                          }
                                        }
                                        else {
                                          pUVar21 = (UsdPreviewSurface *)
                                                    value::Value::as<tinyusdz::Shader>(v,false);
                                        }
                                      }
                                      else {
                                        pUVar21 = (UsdPreviewSurface *)
                                                  value::Value::as<tinyusdz::Material>(v,false);
                                      }
                                      goto LAB_0028a7fb;
                                    }
                                    pRVar16 = value::Value::as<tinyusdz::RectLight>(v,false);
                                  }
                                  else {
                                    pRVar16 = (RectLight *)
                                              value::Value::as<tinyusdz::DiskLight>(v,false);
                                  }
                                }
                                else {
                                  pRVar16 = (RectLight *)
                                            value::Value::as<tinyusdz::CylinderLight>(v,false);
                                }
                              }
                              else {
                                pRVar16 = (RectLight *)
                                          value::Value::as<tinyusdz::SphereLight>(v,false);
                              }
                            }
                            else {
                              pRVar16 = (RectLight *)value::Value::as<tinyusdz::DomeLight>(v,false);
                            }
                            pUVar21 = (UsdPreviewSurface *)&(pRVar16->super_BoundableLight).name;
                            goto LAB_0028a7fb;
                          }
                          pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomBasisCurves>(v,false);
                        }
                        else {
                          pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomCamera>(v,false);
                        }
                      }
                      else {
                        pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomCone>(v,false);
                      }
                    }
                    else {
                      pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomSphere>(v,false);
                    }
                  }
                  else {
                    pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomCylinder>(v,false);
                  }
                }
                else {
                  pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomCapsule>(v,false);
                }
              }
              else {
                pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomCube>(v,false);
              }
            }
            else {
              pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GeomPoints>(v,false);
            }
          }
          else {
            pGVar5 = value::Value::as<tinyusdz::GeomMesh>(v,false);
          }
        }
        else {
          pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::GPrim>(v,false);
        }
      }
      else {
        pGVar5 = (GeomMesh *)value::Value::as<tinyusdz::Xform>(v,false);
      }
      pUVar21 = (UsdPreviewSurface *)&(pGVar5->super_GPrim).name;
      goto LAB_0028a7fb;
    }
    pGVar2 = (GeomSubset *)value::Value::as<tinyusdz::Scope>(v,false);
  }
  else {
    pGVar2 = (GeomSubset *)value::Value::as<tinyusdz::Model>(v,false);
  }
LAB_0028a7f5:
  pUVar21 = (UsdPreviewSurface *)&pGVar2->name;
LAB_0028a7fb:
  ::std::__cxx11::string::_M_assign((string *)pUVar21);
  return true;
}

Assistant:

bool SetPrimElementName(value::Value &v, const std::string &elementName) {
  // Lookup name field of Prim class
  bool ok{false};

#define SET_ELEMENT_NAME(__name, __ty) \
  if (v.as<__ty>()) {                  \
    v.as<__ty>()->name = __name;       \
    ok = true;                         \
  } else

  SET_ELEMENT_NAME(elementName, Model)
  SET_ELEMENT_NAME(elementName, Scope)
  SET_ELEMENT_NAME(elementName, Xform)
  SET_ELEMENT_NAME(elementName, GPrim)
  SET_ELEMENT_NAME(elementName, GeomMesh)
  SET_ELEMENT_NAME(elementName, GeomPoints)
  SET_ELEMENT_NAME(elementName, GeomCube)
  SET_ELEMENT_NAME(elementName, GeomCapsule)
  SET_ELEMENT_NAME(elementName, GeomCylinder)
  SET_ELEMENT_NAME(elementName, GeomSphere)
  SET_ELEMENT_NAME(elementName, GeomCone)
  SET_ELEMENT_NAME(elementName, GeomSubset)
  SET_ELEMENT_NAME(elementName, GeomCamera)
  SET_ELEMENT_NAME(elementName, GeomBasisCurves)
  SET_ELEMENT_NAME(elementName, DomeLight)
  SET_ELEMENT_NAME(elementName, SphereLight)
  SET_ELEMENT_NAME(elementName, CylinderLight)
  SET_ELEMENT_NAME(elementName, DiskLight)
  SET_ELEMENT_NAME(elementName, RectLight)
  SET_ELEMENT_NAME(elementName, Material)
  SET_ELEMENT_NAME(elementName, Shader)
  // TODO: set element name must be handled in Shader class
  SET_ELEMENT_NAME(elementName, UsdPreviewSurface)
  SET_ELEMENT_NAME(elementName, UsdUVTexture)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_int)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float2)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float3)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_float4)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_string)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_normal)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_vector)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_point)
  SET_ELEMENT_NAME(elementName, UsdPrimvarReader_matrix)
  //
  SET_ELEMENT_NAME(elementName, SkelRoot)
  SET_ELEMENT_NAME(elementName, Skeleton)
  SET_ELEMENT_NAME(elementName, SkelAnimation)
  SET_ELEMENT_NAME(elementName, BlendShape) { return false; }

#undef SET_ELEMENT_NAME

  return ok;
}